

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmfilegen.cpp
# Opt level: O2

CommandOptions * CreateLargeFile(CommandOptions *Options)

{
  byte_t *pbVar1;
  uint *puVar2;
  long in_RSI;
  ui32_t write_count;
  ByteString FB;
  FileWriter Writer;
  CTR_Setup counter;
  ByteString local_220 [16];
  int local_210;
  FileWriter local_208 [56];
  Result_t local_1d0 [104];
  Result_t local_168 [104];
  CTR_Setup local_100;
  
  Kumu::FileWriter::FileWriter(local_208);
  Kumu::ByteString::ByteString(local_220);
  Kumu::ByteString::Capacity((uint)local_168);
  Kumu::Result_t::~Result_t(local_168);
  if (local_210 != 0x100000) {
    __assert_fail("FB.Capacity() == Megabyte",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/kmfilegen.cpp"
                  ,0x12e,"Result_t CreateLargeFile(CommandOptions &)");
  }
  fprintf(_stderr,"Writing %u chunks:\n",(ulong)*(uint *)(in_RSI + 0x58));
  s_Nonce = *(ui32_t *)(in_RSI + 0x58);
  Kumu::FileWriter::OpenWrite((string *)Options);
  if ((-1 < *(int *)Options) && (*(int *)(in_RSI + 0x58) != 0)) {
    pbVar1 = Kumu::ByteString::Data(local_220);
    CTR_Setup::SetupWrite(&local_100,pbVar1);
    pbVar1 = Kumu::ByteString::Data(local_220);
    CTR_Setup::FillRandom(&local_100,pbVar1 + 0x20,0xfffe0);
    puVar2 = (uint *)Kumu::ByteString::RoData(local_220);
    Kumu::FileWriter::Write((uchar *)local_1d0,(uint)local_208,puVar2);
    Kumu::Result_t::operator=((Result_t *)Options,local_1d0);
    Kumu::Result_t::~Result_t(local_1d0);
    __assert_fail("write_count == Megabyte",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/kmfilegen.cpp"
                  ,0x13c,"Result_t CreateLargeFile(CommandOptions &)");
  }
  fputs("\n",_stderr);
  Kumu::ByteString::~ByteString(local_220);
  Kumu::FileWriter::~FileWriter(local_208);
  return Options;
}

Assistant:

Result_t
CreateLargeFile(CommandOptions& Options)
{
  ui32_t write_total = 0;
  ui32_t write_count = 0;
  FileWriter  Writer;
  ByteString  FB;

  FB.Capacity(Megabyte);
  assert(FB.Capacity() == Megabyte);

  fprintf(stderr, "Writing %u chunks:\n", Options.chunk_count);
  s_Nonce = Options.chunk_count;
  Result_t result = Writer.OpenWrite(Options.filename);

  while ( KM_SUCCESS(result) && write_total < Options.chunk_count )
    {
      if ( KM_SUCCESS(result))
	{
	  CTR_Setup counter;
	  counter.SetupWrite(FB.Data());
	  counter.FillRandom(FB.Data() + counter.WriteSize(), Megabyte - counter.WriteSize());
	  result = Writer.Write(FB.RoData(), Megabyte, &write_count);
	  assert(write_count == Megabyte);
	  fprintf(stderr, "\r%8u ", ++write_total);
	}
    }
  
  fputs("\n", stderr);

  return result;
}